

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeSetNumCols(Vdbe *p,int nResColumn)

{
  sqlite3 *db;
  Mem *pMVar1;
  int *piVar2;
  uint uVar3;
  
  db = p->db;
  if (p->nResColumn != 0) {
    releaseMemArray(p->aColName,(uint)p->nResColumn * 2);
    if (p->aColName != (Mem *)0x0) {
      sqlite3DbFreeNN(db,p->aColName);
    }
  }
  p->nResColumn = (u16)nResColumn;
  pMVar1 = (Mem *)sqlite3DbMallocRawNN(db,(long)(nResColumn * 2) * 0x38);
  p->aColName = pMVar1;
  if (0 < nResColumn && pMVar1 != (Mem *)0x0) {
    uVar3 = nResColumn * 2 + 1;
    piVar2 = &pMVar1->szMalloc;
    do {
      *(u16 *)(piVar2 + -3) = 1;
      *(sqlite3 **)(piVar2 + -2) = db;
      *piVar2 = 0;
      uVar3 = uVar3 - 1;
      piVar2 = piVar2 + 0xe;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetNumCols(Vdbe *p, int nResColumn){
  int n;
  sqlite3 *db = p->db;

  if( p->nResColumn ){
    releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
    sqlite3DbFree(db, p->aColName);
  }
  n = nResColumn*COLNAME_N;
  p->nResColumn = (u16)nResColumn;
  p->aColName = (Mem*)sqlite3DbMallocRawNN(db, sizeof(Mem)*n );
  if( p->aColName==0 ) return;
  initMemArray(p->aColName, n, db, MEM_Null);
}